

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image,uint32_t startX,uint32_t startY,uint32_t width,
               uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  imageException *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if ((((!bVar1) &&
       (bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                          ((ImageTemplate<unsigned_char> *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)), bVar1))
      && (in_ECX != 0)) &&
     ((in_R8D != 0 &&
      (uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI), in_ESI + in_ECX <= uVar2
      )))) {
    uVar3 = in_EDX + in_R8D;
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
    if ((uVar3 <= uVar2) && ((in_ECX <= in_ESI + in_ECX && (in_R8D <= in_EDX + in_R8D)))) {
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException(unaff_retaddr,(char *)in_RDI);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ParameterValidation( const TImage & image, uint32_t startX, uint32_t startY, uint32_t width, uint32_t height )
    {
        if( image.empty() || !IsCorrectColorCount( image ) || width == 0 || height == 0 || startX + width > image.width() || startY + height > image.height() ||
            startX + width < width || startY + height < height )
            throw imageException( "Bad input parameters in image function" );
    }